

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O3

Point2f __thiscall pbrt::PaddedSobolSampler::Get2D(PaddedSobolSampler *this)

{
  uint uVar1;
  uint uVar2;
  uint hash;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint *puVar6;
  uint32_t a;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  Float FVar11;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 in_ZMM2 [64];
  undefined1 in_XMM3 [16];
  span<const_unsigned_int> C;
  span<const_unsigned_int> C_00;
  undefined1 auVar12 [16];
  undefined1 extraout_var [60];
  
  uVar7 = (this->pixel).super_Tuple2<pbrt::Point2,_int>.x;
  uVar1 = (this->pixel).super_Tuple2<pbrt::Point2,_int>.y;
  uVar4 = this->samplesPerPixel;
  uVar2 = this->dimension;
  uVar5 = (long)*(int *)(Options + 4) ^
          (long)(int)uVar2 << 0x10 ^ (ulong)uVar1 << 0x20 ^ (ulong)uVar7 << 0x30;
  uVar5 = (uVar5 >> 0x1f ^ uVar5) * 0x7fb5d329728ea185;
  uVar10 = (uVar5 >> 0x1b ^ uVar5) * -0x7e25210b43d22bb3;
  uVar3 = this->sampleIndex;
  uVar9 = uVar4 - 1 >> 1 | uVar4 - 1;
  uVar9 = uVar9 >> 2 | uVar9;
  uVar5 = uVar10 >> 0x21 ^ uVar10;
  uVar9 = uVar9 >> 4 | uVar9;
  uVar9 = uVar9 >> 8 | uVar9;
  uVar9 = uVar9 >> 0x10 | uVar9;
  hash = (uint)(uVar5 >> 8);
  do {
    uVar3 = (uVar3 ^ (uint)uVar5) * -0x1e8f76c3 ^ (uint)(uVar5 >> 0x10) & 0xffff;
    uVar3 = ((uVar3 & uVar9) >> 4 ^ hash & 0xffffff ^ uVar3) * 0x929eb3f ^
            (uint)(uVar5 >> 0x17) & 0x1ff;
    uVar3 = ((uVar3 & uVar9) >> 1 ^ uVar3) * ((uint)(uVar5 >> 0x1b) & 0x1f | 1) * 0x6935fa69;
    uVar3 = ((uVar3 & uVar9) >> 0xb ^ uVar3) * 0x74dcb303;
    uVar3 = ((uVar3 & uVar9) >> 2 ^ uVar3) * -0x61afe33d;
    uVar3 = ((uVar3 & uVar9) >> 2 ^ uVar3) * -0x379f5c21 & uVar9;
    uVar3 = uVar3 >> 5 ^ uVar3;
  } while (uVar4 <= uVar3);
  uVar5 = (ulong)(uVar3 + (uint)uVar5) % (ulong)uVar4;
  this->dimension = uVar2 + 2;
  a = (uint32_t)uVar5;
  if (this->randomizeStrategy != CranleyPatterson) {
    C.n = 0x20;
    C.ptr = &CSobol;
    FVar11 = generateSample(this,C,a,hash);
    C_00.n = 0x20;
    C_00.ptr = &DAT_028c1cb0;
    auVar13._0_4_ = generateSample(this,C_00,a,(uint32_t)(uVar10 >> 0x20));
    auVar13._4_60_ = extraout_var;
    auVar12 = auVar13._0_16_;
    auVar14._4_4_ = extraout_XMM0_Db;
    auVar14._0_4_ = FVar11;
    auVar14._8_4_ = extraout_XMM0_Dc;
    auVar14._12_4_ = extraout_XMM0_Dd;
LAB_0035e1db:
    auVar14 = vinsertps_avx(auVar14,auVar12,0x10);
    return (Point2f)auVar14._0_8_;
  }
  if (-1 < (int)(uVar7 | uVar1 | uVar2)) {
    uVar4 = 0;
    if (a != 0) {
      puVar6 = &CSobol;
      uVar10 = uVar5;
      do {
        if ((uVar10 & 1) != 0) {
          uVar4 = uVar4 ^ *puVar6;
        }
        uVar3 = (uint)uVar10;
        uVar10 = uVar10 >> 1;
        puVar6 = puVar6 + 1;
      } while (1 < uVar3);
    }
    if (-1 < (int)(uVar7 | uVar1 | uVar2 + 1)) {
      iVar8 = vcvttss2usi_avx512f(ZEXT416((uint)(((float)*(ushort *)
                                                          (BlueNoiseTextures +
                                                          (ulong)(uVar1 & 0x7f) * 2 +
                                                          (ulong)((uVar7 & 0x7f) << 8) +
                                                          (ulong)(uVar2 % 0x30 << 0xf)) / 65535.0) *
                                                4.2949673e+09)));
      auVar14 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,uVar4 + iVar8);
      uVar4 = 0;
      iVar8 = vcvttss2usi_avx512f(ZEXT416((uint)(((float)*(ushort *)
                                                          (BlueNoiseTextures +
                                                          (ulong)(uVar1 & 0x7f) * 2 +
                                                          (ulong)((uVar7 & 0x7f) << 8) +
                                                          (ulong)((uVar2 + 1) % 0x30 << 0xf)) /
                                                 65535.0) * 4.2949673e+09)));
      if (a != 0) {
        puVar6 = &DAT_028c1cb0;
        do {
          if ((uVar5 & 1) != 0) {
            uVar4 = uVar4 ^ *puVar6;
          }
          uVar7 = (uint)uVar5;
          uVar5 = uVar5 >> 1;
          puVar6 = puVar6 + 1;
        } while (1 < uVar7);
      }
      auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                           ZEXT416((uint)(auVar14._0_4_ * 2.3283064e-10)));
      auVar12 = vcvtusi2ss_avx512f(in_XMM3,uVar4 + iVar8);
      auVar12 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                           ZEXT416((uint)(auVar12._0_4_ * 2.3283064e-10)));
      goto LAB_0035e1db;
    }
  }
  LogFatal<char_const(&)[40]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/bluenoise.h"
             ,0x17,"Check failed: %s",(char (*) [40])"textureIndex >= 0 && px >= 0 && py >= 0");
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        // Get permuted index for current pixel sample
        uint64_t hash = MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                                ((uint64_t)dimension << 16) ^ GetOptions().seed);
        int index = PermutationElement(sampleIndex, samplesPerPixel, hash);

        int dim = dimension;
        dimension += 2;
        if (randomizeStrategy == RandomizeStrategy::CranleyPatterson)
            // Return 2D sample randomized with Cranley-Patterson rotation
            return {SampleGeneratorMatrix(
                        CSobol[0], index,
                        CranleyPattersonRotator(BlueNoise(dim, pixel.x, pixel.y))),
                    SampleGeneratorMatrix(
                        CSobol[1], index,
                        CranleyPattersonRotator(BlueNoise(dim + 1, pixel.x, pixel.y)))};

        else
            return {generateSample(CSobol[0], index, hash >> 8),
                    generateSample(CSobol[1], index, hash >> 32)};
    }